

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
PlanningUnitMADPDiscrete::JointToIndividualPolicyDomainIndicesRef
          (PlanningUnitMADPDiscrete *this,Index jdI,PolicyDomainCategory cat)

{
  undefined8 uVar1;
  int in_EDX;
  undefined4 in_ESI;
  E *in_RDI;
  undefined4 in_stack_00000188;
  Index in_stack_0000018c;
  PlanningUnitMADPDiscrete *in_stack_00000190;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_8;
  
  if (in_EDX == 0) {
    uVar1 = __cxa_allocate_exception(0x28);
    E::E(in_RDI,(char *)CONCAT44(in_ESI,in_EDX));
    __cxa_throw(uVar1,&E::typeinfo,E::~E);
  }
  if (in_EDX == 1) {
    local_8 = JointToIndividualObservationHistoryIndicesRef(in_stack_00000190,in_stack_0000018c);
  }
  else {
    if (in_EDX != 2) {
      uVar1 = __cxa_allocate_exception(0x28);
      E::E(in_RDI,(char *)CONCAT44(in_ESI,in_EDX));
      __cxa_throw(uVar1,&E::typeinfo,E::~E);
    }
    local_8 = JointToIndividualActionObservationHistoryIndicesRef
                        (in_stack_00000190,CONCAT44(in_stack_0000018c,in_stack_00000188));
  }
  return local_8;
}

Assistant:

const vector<Index>& PlanningUnitMADPDiscrete::JointToIndividualPolicyDomainIndicesRef( 
    Index jdI, PolicyGlobals::PolicyDomainCategory cat) const
{
    switch ( cat )
    {
    case PolicyGlobals::OHIST_INDEX :
        return JointToIndividualObservationHistoryIndicesRef(jdI);
        break;
    case PolicyGlobals::AOHIST_INDEX :
        return JointToIndividualActionObservationHistoryIndicesRef(jdI);
        break;
    case PolicyGlobals::TYPE_INDEX : 
        throw(E("JointToIndividualPolicyDomainIndicesRef: types are not a valid policy domain for a PlanningUnitMADPDiscrete"));
        break;
    default:
        throw(E("JointToIndividualPolicyDomainIndicesRef: incorrect JointPolicyDiscrete::PolicyGlobals::PolicyDomainCategory"));
        break;
    }
}